

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

BOOL Js::JavascriptOperators::GetPropertyReference_Internal
               (Var instance,RecyclableObject *propertyObject,bool isRoot,PropertyId propertyId,
               Var *value,ScriptContext *requestContext,PropertyValueInfo *info)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  RootObjectBase *pRVar4;
  RecyclableObject *pRVar5;
  DynamicType *this;
  DynamicTypeHandler *pDVar6;
  PropertyRecord *pPVar7;
  undefined4 *puVar8;
  _func_int **local_60;
  Var property;
  DynamicTypeHandler *dynamicTypeHandler;
  DynamicObject *dynamicObject;
  RecyclableObject *object;
  ScriptContext *pSStack_38;
  BOOL foundProperty;
  ScriptContext *requestContext_local;
  Var *value_local;
  PropertyId propertyId_local;
  bool isRoot_local;
  RecyclableObject *propertyObject_local;
  Var instance_local;
  
  pSStack_38 = requestContext;
  requestContext_local = (ScriptContext *)value;
  value_local._0_4_ = propertyId;
  value_local._7_1_ = isRoot;
  _propertyId_local = (DynamicObject *)propertyObject;
  propertyObject_local = (RecyclableObject *)instance;
  bVar2 = TaggedNumber::Is(instance);
  if (bVar2) {
    PropertyValueInfo::ClearCacheInfo(info);
  }
  object._4_4_ = 0;
  dynamicObject = _propertyId_local;
  if ((value_local._7_1_ & 1) != 0) {
    pRVar4 = VarTo<Js::RootObjectBase,Js::RecyclableObject>
                       (&_propertyId_local->super_RecyclableObject);
    object._4_4_ = (*(pRVar4->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
                     super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x6d])
                             (pRVar4,propertyObject_local,(ulong)(uint)value_local,
                              requestContext_local,info,pSStack_38);
  }
  if (object._4_4_ == 0) {
    object._4_4_ = PropertyReferenceWalk
                             (propertyObject_local,(RecyclableObject **)&dynamicObject,
                              (uint)value_local,(Var *)requestContext_local,info,pSStack_38);
  }
  if (object._4_4_ == 0) {
    pRVar5 = ScriptContext::GetMissingPropertyResult(pSStack_38);
    (requestContext_local->super_ScriptContextInfo)._vptr_ScriptContextInfo = (_func_int **)pRVar5;
    instance_local._4_4_ = object._4_4_;
  }
  else {
    bVar2 = ScriptContext::IsUndeclBlockVar
                      (pSStack_38,
                       (requestContext_local->super_ScriptContextInfo)._vptr_ScriptContextInfo);
    if (bVar2) {
      JavascriptError::ThrowReferenceError(pSStack_38,-0x7ff5ec07,(PCWSTR)0x0);
    }
    bVar2 = DynamicObject::IsBaseDynamicObject(dynamicObject);
    if (bVar2) {
      dynamicTypeHandler = (DynamicTypeHandler *)dynamicObject;
      this = DynamicObject::GetDynamicType(dynamicObject);
      pDVar6 = DynamicType::GetTypeHandler(this);
      local_60 = (_func_int **)0x0;
      property = pDVar6;
      pPVar7 = ScriptContext::GetPropertyName(pSStack_38,(uint)value_local);
      uVar3 = (*pDVar6->_vptr_DynamicTypeHandler[0x5c])(pDVar6,pPVar7,&local_60,pSStack_38);
      if ((((uVar3 & 1) != 0) && (requestContext_local != (ScriptContext *)0x0)) &&
         ((requestContext_local->super_ScriptContextInfo)._vptr_ScriptContextInfo != local_60)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x947,"(value == nullptr || *value == property)",
                                    "value == nullptr || *value == property");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
    }
    CacheOperators::CachePropertyRead
              (propertyObject_local,&dynamicObject->super_RecyclableObject,
               (bool)(value_local._7_1_ & 1),(uint)value_local,false,info,pSStack_38);
    instance_local._4_4_ = 1;
  }
  return instance_local._4_4_;
}

Assistant:

BOOL JavascriptOperators::GetPropertyReference_Internal(Var instance, RecyclableObject* propertyObject, const bool isRoot, PropertyId propertyId, Var* value, ScriptContext* requestContext, PropertyValueInfo* info)
    {
        if (TaggedNumber::Is(instance))
        {
            PropertyValueInfo::ClearCacheInfo(info);
        }
        BOOL foundProperty = FALSE;
        RecyclableObject* object = propertyObject;

        if (isRoot)
        {
            foundProperty = VarTo<RootObjectBase>(object)->GetRootPropertyReference(instance, propertyId, value, info, requestContext);
        }
        if (!foundProperty)
        {
            foundProperty = PropertyReferenceWalk(instance, &object, propertyId, value, info, requestContext);
        }

        if (!foundProperty)
        {
#if defined(TELEMETRY_JSO) || defined(TELEMETRY_AddToCache) // enabled for `TELEMETRY_AddToCache`, because this is the property-not-found codepath where the normal TELEMETRY_AddToCache code wouldn't be executed.
            if (TELEMETRY_PROPERTY_OPCODE_FILTER(propertyId))
            {
                if (info && info->AllowResizingPolymorphicInlineCache()) // If in interpreted mode, not JIT.
                {
                    requestContext->GetTelemetry().GetOpcodeTelemetry().GetProperty(instance, propertyId, nullptr);
                }
            }
#endif
            *value = requestContext->GetMissingPropertyResult();
            return foundProperty;
        }

        if (requestContext->IsUndeclBlockVar(*value))
        {
            JavascriptError::ThrowReferenceError(requestContext, JSERR_UseBeforeDeclaration);
        }

#if ENABLE_FIXED_FIELDS && DBG
        if (DynamicObject::IsBaseDynamicObject(object))
        {
            DynamicObject* dynamicObject = (DynamicObject*)object;
            DynamicTypeHandler* dynamicTypeHandler = dynamicObject->GetDynamicType()->GetTypeHandler();
            Var property = nullptr;
            if (dynamicTypeHandler->CheckFixedProperty(requestContext->GetPropertyName(propertyId), &property, requestContext))
            {
                Assert(value == nullptr || *value == property);
            }
        }
#endif

        CacheOperators::CachePropertyRead(instance, object, isRoot, propertyId, false, info, requestContext);
        return TRUE;
    }